

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O0

parser_error parse_quest_race(parser *p)

{
  void *pvVar1;
  char *name_00;
  monster_race *pmVar2;
  char *name;
  quest *q;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  name_00 = parser_getstr(p,"race");
  if (pvVar1 != (void *)0x0) {
    pmVar2 = lookup_monster(name_00);
    *(monster_race **)((long)pvVar1 + 0x20) = pmVar2;
    if (*(long *)((long)pvVar1 + 0x20) == 0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_MONSTER;
    }
    else {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    return p_local._4_4_;
  }
  __assert_fail("q",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-quest.c"
                ,0x4e,"enum parser_error parse_quest_race(struct parser *)");
}

Assistant:

static enum parser_error parse_quest_race(struct parser *p) {
	struct quest *q = parser_priv(p);
	const char *name = parser_getstr(p, "race");
	assert(q);

	q->race = lookup_monster(name);
	if (!q->race)
		return PARSE_ERROR_INVALID_MONSTER;

	return PARSE_ERROR_NONE;
}